

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O1

void __thiscall
ft::
treeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::BSTerase(treeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_ft::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ft::allocator<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *this,iterator *position)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Colour CVar2;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *ptVar3;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *ptVar4;
  pointer pcVar5;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *ptVar6;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  **pptVar7;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *ptVar8;
  Colour CVar9;
  treeNode<ft::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *x;
  bool bVar10;
  
  ptVar3 = (this->m_tree).NIL;
  ((this->m_tree).m_first)->parent->left = ptVar3;
  ((this->m_tree).m_last)->parent->right = ptVar3;
  ptVar4 = position->m_node;
  CVar9 = ptVar4->colour;
  ptVar8 = ptVar4->left;
  x = ptVar4->right;
  if (ptVar8 != ptVar3) {
    if (x == ptVar3) {
      if ((this->m_tree).m_root == ptVar4) {
        pptVar7 = &(this->m_tree).m_root;
LAB_00109b84:
        *pptVar7 = ptVar8;
      }
      else {
        ptVar3 = ptVar4->parent;
        if (ptVar3->left == ptVar4) {
          pptVar7 = &ptVar3->left;
          goto LAB_00109b84;
        }
        if (ptVar3->right == ptVar4) {
          pptVar7 = &ptVar3->right;
          goto LAB_00109b84;
        }
      }
      ptVar8->parent = ptVar4->parent;
      x = ptVar8;
      goto LAB_00109b92;
    }
    ptVar3 = position->m_tree->NIL;
    ptVar8 = ptVar4;
    if (x == ptVar3) {
      do {
        ptVar6 = ptVar8->parent;
        bVar10 = ptVar6->right == ptVar8;
        ptVar8 = ptVar6;
      } while (bVar10);
    }
    else {
      do {
        ptVar6 = x;
        x = ptVar6->left;
      } while (ptVar6->left != ptVar3);
    }
    CVar2 = ptVar6->colour;
    x = ptVar6->right;
    ptVar3 = ptVar6->parent;
    ptVar8 = x;
    if (ptVar3 != ptVar4) {
      if ((this->m_tree).m_root == ptVar6) {
        pptVar7 = &(this->m_tree).m_root;
LAB_00109b27:
        *pptVar7 = x;
      }
      else {
        if (ptVar3->left == ptVar6) {
          pptVar7 = &ptVar3->left;
          goto LAB_00109b27;
        }
        if (ptVar3->right == ptVar6) {
          pptVar7 = &ptVar3->right;
          goto LAB_00109b27;
        }
      }
      x->parent = ptVar3;
      ptVar8 = ptVar4->right;
      ptVar6->right = ptVar8;
    }
    ptVar8->parent = ptVar6;
    if ((this->m_tree).m_root == ptVar4) {
      pptVar7 = &(this->m_tree).m_root;
LAB_00109b60:
      *pptVar7 = ptVar6;
    }
    else {
      ptVar3 = ptVar4->parent;
      if (ptVar3->left == ptVar4) {
        pptVar7 = &ptVar3->left;
        goto LAB_00109b60;
      }
      if (ptVar3->right == ptVar4) {
        pptVar7 = &ptVar3->right;
        goto LAB_00109b60;
      }
    }
    ptVar6->parent = ptVar4->parent;
    ptVar3 = ptVar4->left;
    ptVar6->left = ptVar3;
    ptVar3->parent = ptVar6;
    ptVar6->colour = CVar9;
    CVar9 = CVar2;
    goto LAB_00109b92;
  }
  if ((this->m_tree).m_root == ptVar4) {
    pptVar7 = &(this->m_tree).m_root;
LAB_00109b10:
    *pptVar7 = x;
  }
  else {
    ptVar3 = ptVar4->parent;
    if (ptVar3->left == ptVar4) {
      pptVar7 = &ptVar3->left;
      goto LAB_00109b10;
    }
    if (ptVar3->right == ptVar4) {
      pptVar7 = &ptVar3->right;
      goto LAB_00109b10;
    }
  }
  x->parent = ptVar4->parent;
LAB_00109b92:
  pcVar5 = (ptVar4->value).first._M_dataplus._M_p;
  paVar1 = &(ptVar4->value).first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != paVar1) {
    operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(ptVar4);
  if (CVar9 == BLACK) {
    fixEraseViolation(this,x);
  }
  attach(this);
  return;
}

Assistant:

void	BSTerase(iterator position) {
		this->detach();

		node*	z = position.node();
		node*	y = z;
		node*	x = NULL;
		enum Colour	origYColour = y->colour;

		if (z->left == this->NIL()) { // z has only right child or no children
			x = z->right;
			this->transplant(z, z->right);
		}
		else if (z->right == this->NIL()) { // z has only left child
			x = z->left;
			this->transplant(z, z->left);
		}
		else { // z has two children
			iterator temp = position;
			++temp;
			y = temp.node();

			origYColour = y->colour;
			x = y->right;
			if (y->parent == z)
				x->parent = y;
			else {
				this->transplant(y, y->right);
				y->right = z->right;
				y->right->parent = y;
			}
			this->transplant(z, y);
			y->left = z->left;
			y->left->parent = y;
			y->colour = z->colour;
		}

		this->m_alloc.destroy(z);
		this->m_alloc.deallocate(z, 1);

		if (origYColour == BLACK) {
			this->fixEraseViolation(x);
		}

		this->attach();
	}